

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-run-once.c
# Opt level: O0

int run_test_run_once(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  
  puVar2 = uv_default_loop();
  uv_idle_init(puVar2,&idle_handle);
  uv_idle_start(&idle_handle,idle_cb);
  do {
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_ONCE);
  } while (iVar1 != 0);
  if ((long)idle_counter == 0x40) {
    puVar2 = uv_default_loop();
    close_loop(puVar2);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if ((long)iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-run-once.c"
            ,0x2e,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-run-once.c"
          ,0x2c,"idle_counter","==","64",(long)idle_counter,"==",0x40);
  abort();
}

Assistant:

TEST_IMPL(run_once) {
  uv_idle_init(uv_default_loop(), &idle_handle);
  uv_idle_start(&idle_handle, idle_cb);

  while (uv_run(uv_default_loop(), UV_RUN_ONCE));
  ASSERT_EQ(idle_counter, NUM_TICKS);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}